

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

atom * orientedAtoms(xformDatabase *xdb)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  atom *paVar4;
  long lVar5;
  xformAtomRecords **ppxVar6;
  xformAtomRecords *pxVar7;
  matrix4 *pmVar8;
  atom *paVar9;
  matrix4 *pmVar10;
  transformData *ptVar11;
  byte bVar12;
  matrix4 ctm;
  matrix4 rsltMat;
  matrix4 mStack_128;
  matrix4 local_a8;
  
  bVar12 = 0;
  if (xdb == (xformDatabase *)0x0) {
    return (atom *)0x0;
  }
  xdb->nstack = 1;
  v3identityMat(xdb->ctmstack[0]);
  v3identityMat(&mStack_128);
  ptVar11 = xdb->xforms;
  if (ptVar11 != (transformData *)0x0) {
    do {
      if (ptVar11->type == 4) {
        iVar2 = xdb->nstack;
        if (iVar2 < 1) {
          lVar5 = 0x10;
          pmVar8 = (matrix4 *)0x0;
          pmVar10 = &mStack_128;
          goto LAB_00121c60;
        }
        pmVar8 = xdb->ctmstack[iVar2 - 1U];
        pmVar10 = &mStack_128;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(double *)pmVar10 = pmVar8->element[0][0];
          pmVar8 = (matrix4 *)((long)pmVar8 + ((ulong)bVar12 * -2 + 1) * 8);
          pmVar10 = (matrix4 *)((long)pmVar10 + ((ulong)bVar12 * -2 + 1) * 8);
        }
        if (iVar2 != 1) {
          xdb->nstack = iVar2 - 1U;
        }
      }
      else {
        if (ptVar11->type == 3) {
          uVar1 = xdb->nstack;
          if (6 < uVar1 - 1) goto LAB_00121c63;
          xdb->nstack = uVar1 + 1;
          lVar5 = 0x10;
          pmVar8 = &mStack_128;
          pmVar10 = xdb->ctmstack[uVar1];
        }
        else {
          v3matMul(&ptVar11->tmat,&mStack_128,&local_a8);
          lVar5 = 0x10;
          pmVar8 = &local_a8;
          pmVar10 = &mStack_128;
        }
LAB_00121c60:
        for (; lVar5 != 0; lVar5 = lVar5 + -1) {
          pmVar10->element[0][0] = pmVar8->element[0][0];
          pmVar8 = (matrix4 *)((long)pmVar8 + ((ulong)bVar12 * -2 + 1) * 8);
          pmVar10 = (matrix4 *)((long)pmVar10 + ((ulong)bVar12 * -2 + 1) * 8);
        }
      }
LAB_00121c63:
      for (pxVar7 = ptVar11->recs; pxVar7 != (xformAtomRecords *)0x0; pxVar7 = pxVar7->next) {
        paVar4 = pxVar7->a;
        (paVar4->loc).z = (pxVar7->loc).z;
        dVar3 = (pxVar7->loc).y;
        (paVar4->loc).x = (pxVar7->loc).x;
        (paVar4->loc).y = dVar3;
        v3mulPointMat(&paVar4->loc,&mStack_128);
      }
      ptVar11 = ptVar11->next;
    } while (ptVar11 != (transformdata_t *)0x0);
  }
  ppxVar6 = xdb->sortedByRes;
  if ((ppxVar6 == (xformAtomRecords **)0x0) ||
     (pxVar7 = *ppxVar6, pxVar7 == (xformAtomRecords *)0x0)) {
    paVar4 = (atom *)0x0;
  }
  else {
    paVar9 = (atom *)0x0;
    do {
      ppxVar6 = ppxVar6 + 1;
      paVar4 = pxVar7->a;
      paVar4->next = paVar9;
      pxVar7 = *ppxVar6;
      paVar9 = paVar4;
    } while (pxVar7 != (xformAtomRecords *)0x0);
  }
  return paVar4;
}

Assistant:

atom* orientedAtoms(xformDatabase* xdb) {
   transformData* xform = NULL;
   xformAtomRecords* xa = NULL;
   matrix4 ctm, rsltMat;
   atom* alst = NULL, *a = NULL;

   if (xdb) {
      initializeXFStack(xdb);

      v3identityMat(&ctm);

      for (xform = xdb->xforms; xform; xform = xform->next) {
	 if (xform->type == SAVExform) {
	       pushXFStack(xdb, &ctm);
	 }
	 else if (xform->type == RESTORExform) {
	    ctm = * topXFStack(xdb);
	    popXFStack(xdb);
	 }
	 else if (xform != NULLxform) {
	    v3matMul(&(xform->tmat), &ctm, &rsltMat);
	    ctm = rsltMat;
	 }

	 for(xa = xform->recs; xa; xa = xa->next) {
	    a = xa->a;

	    a->loc = xa->loc;                /* apply ctm to the original loc of each atom  */
	    v3mulPointMat(&(a->loc), &ctm); /* and use to set the new position of the atom */
	 }
      }

      alst = NULL;
      if (xdb->sortedByRes) { /* (re-)compose the atom list from the sort index */
	 int i = 0;
	 for(i=0; xdb->sortedByRes[i]; i++) {
	    a = xdb->sortedByRes[i]->a;
	    a->next = alst;
	    alst = a;
	 }
      }
   }

   return alst; /* returns the list of (pre-)sorted atoms */
}